

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

String * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (String *__return_storage_ptr__,Json *this,char *value,size_t length,bool emitUTF8)

{
  Json *pJVar1;
  Json JVar2;
  uint uVar3;
  Json *pJVar4;
  long *plVar5;
  Json *pJVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  char local_7c;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (this == (Json *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  pJVar1 = this + (long)value;
  pJVar6 = this;
  if (0 < (long)value >> 2) {
    pJVar6 = this + ((ulong)value & 0xfffffffffffffffc);
    lVar9 = ((long)value >> 2) + 1;
    pJVar4 = this + 3;
    do {
      JVar2 = pJVar4[-3];
      if (((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) || (JVar2 == (Json)0x5c)) ||
         ((char)JVar2 < '\0')) {
        pJVar4 = pJVar4 + -3;
        goto LAB_00136df8;
      }
      JVar2 = pJVar4[-2];
      if ((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) ||
         ((JVar2 == (Json)0x5c || ((char)JVar2 < '\0')))) {
        pJVar4 = pJVar4 + -2;
        goto LAB_00136df8;
      }
      JVar2 = pJVar4[-1];
      if ((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) ||
         ((JVar2 == (Json)0x5c || ((char)JVar2 < '\0')))) {
        pJVar4 = pJVar4 + -1;
        goto LAB_00136df8;
      }
      JVar2 = *pJVar4;
      if (((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) || (JVar2 == (Json)0x5c)) ||
         ((char)JVar2 < '\0')) goto LAB_00136df8;
      lVar9 = lVar9 + -1;
      pJVar4 = pJVar4 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)pJVar1 - (long)pJVar6;
  if (lVar9 != 1) {
    pJVar4 = pJVar6;
    if (lVar9 != 2) {
      pJVar4 = pJVar1;
      if (((lVar9 != 3) || (JVar2 = *pJVar6, pJVar4 = pJVar6, (byte)JVar2 < 0x20)) ||
         ((JVar2 == (Json)0x22 || ((JVar2 == (Json)0x5c || ((char)JVar2 < '\0'))))))
      goto LAB_00136df8;
      pJVar4 = pJVar6 + 1;
    }
    JVar2 = *pJVar4;
    if (((((byte)JVar2 < 0x20) || (JVar2 == (Json)0x22)) || (JVar2 == (Json)0x5c)) ||
       ((char)JVar2 < '\0')) goto LAB_00136df8;
    pJVar6 = pJVar4 + 1;
  }
  JVar2 = *pJVar6;
  pJVar4 = pJVar6;
  if (((0x1f < (byte)JVar2) && (JVar2 != (Json)0x22)) &&
     ((JVar2 != (Json)0x5c && (-1 < (char)JVar2)))) {
    pJVar4 = pJVar1;
  }
LAB_00136df8:
  if (pJVar4 == pJVar1) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"\"","");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      lVar9 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (value != (char *)0x0) {
      do {
        JVar2 = *this;
        uVar3 = (uint)(byte)JVar2;
        switch(JVar2) {
        case (Json)0x8:
          break;
        case (Json)0x9:
          break;
        case (Json)0xa:
          break;
        case (Json)0xb:
switchD_00136e64_caseD_b:
          local_7c = (char)length;
          uVar10 = (uint)(byte)JVar2;
          if (local_7c == '\0') {
            if ((char)JVar2 < '\0') {
              if ((byte)JVar2 < 0xe0) {
                if (1 < (long)pJVar1 - (long)this) {
                  uVar10 = (uVar10 & 0x1f) << 6;
                  pJVar6 = this + 1;
                  this = this + 1;
                  uVar3 = (byte)*pJVar6 & 0x3f | uVar10;
                  if (uVar10 < 0x80) {
                    uVar3 = 0xfffd;
                  }
                  goto LAB_00136fe8;
                }
              }
              else if ((byte)JVar2 < 0xf0) {
                if (2 < (long)pJVar1 - (long)this) {
                  uVar3 = ((byte)JVar2 & 0xf) << 0xc;
                  uVar10 = ((byte)this[1] & 0x3f) << 6 | uVar3;
                  this = this + 2;
                  if ((0xdfff < uVar3) || (uVar10 < 0xd800)) {
                    uVar3 = (byte)*this & 0x3f | uVar10;
                    bVar11 = uVar10 < 0x800;
                    goto LAB_00136fdf;
                  }
                }
              }
              else if (3 < (long)pJVar1 - (long)this && (byte)JVar2 < 0xf8) {
                uVar10 = ((byte)this[1] & 0x3f) << 0xc | (uVar10 & 7) << 0x12;
                pJVar6 = this + 2;
                pJVar4 = this + 3;
                this = this + 3;
                uVar3 = (byte)*pJVar4 & 0x3f | ((byte)*pJVar6 & 0x3f) << 6 | uVar10;
                bVar11 = uVar10 < 0x10000;
LAB_00136fdf:
                if (bVar11) {
                  uVar3 = 0xfffd;
                }
                goto LAB_00136fe8;
              }
              uVar3 = 0xfffd;
            }
LAB_00136fe8:
            if (0x1f < uVar3) {
              if (uVar3 < 0x80) {
                std::__cxx11::string::push_back((char)__return_storage_ptr__);
                goto LAB_00136ecf;
              }
              if (0xffff < uVar3) {
                appendHex(__return_storage_ptr__,uVar3 + 0xf0000 >> 10 & 0x3ff | 0xd800);
                uVar3 = uVar3 & 0x3ff | 0xdc00;
              }
            }
            appendHex(__return_storage_ptr__,uVar3);
          }
          else if ((byte)JVar2 < 0x20) {
            appendHex(__return_storage_ptr__,uVar10);
          }
          else {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
          goto LAB_00136ecf;
        case (Json)0xc:
          break;
        case (Json)0xd:
          break;
        default:
          if ((JVar2 != (Json)0x5c) && (JVar2 != (Json)0x22)) goto switchD_00136e64_caseD_b;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00136ecf:
        this = this + 1;
      } while (this != pJVar1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static String valueToQuotedStringN(const char* value, size_t length,
                                   bool emitUTF8 = false) {
  if (value == nullptr)
    return "";

  if (!doesAnyCharRequireEscaping(value, length))
    return String("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to String is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  String::size_type maxsize = length * 2 + 3; // allescaped+quotes+NULL
  String result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default: {
      if (emitUTF8) {
        unsigned codepoint = static_cast<unsigned char>(*c);
        if (codepoint < 0x20) {
          appendHex(result, codepoint);
        } else {
          appendRaw(result, codepoint);
        }
      } else {
        unsigned codepoint = utf8ToCodepoint(c, end); // modifies `c`
        if (codepoint < 0x20) {
          appendHex(result, codepoint);
        } else if (codepoint < 0x80) {
          appendRaw(result, codepoint);
        } else if (codepoint < 0x10000) {
          // Basic Multilingual Plane
          appendHex(result, codepoint);
        } else {
          // Extended Unicode. Encode 20 bits as a surrogate pair.
          codepoint -= 0x10000;
          appendHex(result, 0xd800 + ((codepoint >> 10) & 0x3ff));
          appendHex(result, 0xdc00 + (codepoint & 0x3ff));
        }
      }
    } break;
    }
  }
  result += "\"";
  return result;
}